

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
RepeatedPtrField(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *other)

{
  Rep *pRVar1;
  int iVar2;
  
  (this->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
  (this->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
  (this->super_RepeatedPtrFieldBase).current_size_ = 0;
  (this->super_RepeatedPtrFieldBase).total_size_ = 0;
  if ((other->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
    iVar2 = (other->super_RepeatedPtrFieldBase).total_size_;
    pRVar1 = (other->super_RepeatedPtrFieldBase).rep_;
    (this->super_RepeatedPtrFieldBase).current_size_ =
         (other->super_RepeatedPtrFieldBase).current_size_;
    (this->super_RepeatedPtrFieldBase).total_size_ = iVar2;
    (this->super_RepeatedPtrFieldBase).rep_ = pRVar1;
    (other->super_RepeatedPtrFieldBase).current_size_ = 0;
    (other->super_RepeatedPtrFieldBase).total_size_ = 0;
    (other->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
  }
  else {
    internal::RepeatedPtrFieldBase::
    CopyFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  }
  return;
}

Assistant:

inline RepeatedPtrField<Element>::RepeatedPtrField(
    RepeatedPtrField&& other) noexcept
    : RepeatedPtrField() {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArena()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
}